

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O3

void __thiscall
ggml::cpu::aarch64::tensor_traits<block_iq4_nl,_4L,_4L,_(ggml_type)8>::forward_mul_mat_id
          (tensor_traits<block_iq4_nl,_4L,_4L,_(ggml_type)8> *this,ggml_compute_params *params,
          ggml_tensor *op)

{
  int iVar1;
  int iVar2;
  ggml_tensor *pgVar3;
  ggml_tensor *pgVar4;
  ggml_tensor *pgVar5;
  int64_t iVar6;
  long lVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  int64_t iVar12;
  long lVar13;
  long lVar14;
  size_t sVar15;
  ulong uVar16;
  ulong uVar17;
  ggml_from_float_t p_Var18;
  int64_t iVar19;
  void *pvVar20;
  ggml_type_traits_cpu *pgVar21;
  size_t sVar22;
  size_t sVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  char *pcVar28;
  long lVar29;
  ulong uVar30;
  long lVar31;
  size_t sVar32;
  long lVar33;
  long lVar34;
  int64_t iVar35;
  long lVar36;
  undefined8 uVar37;
  size_t __n;
  ulong uVar38;
  ulong uVar39;
  uint uVar40;
  long lVar41;
  void *pvVar42;
  void *pvVar43;
  ulong local_108;
  uint local_100;
  
  pgVar3 = op->src[0];
  pgVar4 = op->src[1];
  pgVar5 = op->src[2];
  sVar32 = op->nb[0];
  iVar6 = pgVar3->ne[0];
  lVar7 = pgVar3->ne[1];
  sVar23 = pgVar3->nb[0];
  sVar8 = pgVar4->nb[0];
  sVar9 = pgVar4->nb[1];
  iVar35 = pgVar3->ne[2];
  lVar24 = pgVar3->ne[3];
  sVar10 = pgVar3->nb[1];
  sVar11 = pgVar3->nb[2];
  iVar12 = pgVar4->ne[0];
  lVar13 = pgVar4->ne[1];
  lVar14 = pgVar4->ne[2];
  lVar34 = pgVar4->ne[3];
  sVar15 = pgVar4->nb[2];
  lVar31 = op->ne[3];
  uVar16 = op->nb[1];
  uVar17 = op->nb[2];
  uVar30 = op->nb[3];
  iVar1 = params->ith;
  lVar29 = (long)iVar1;
  lVar27 = (long)params->nth;
  pgVar21 = ggml_get_type_traits_cpu(GGML_TYPE_Q8_0);
  p_Var18 = pgVar21->from_float;
  sVar22 = ggml_type_size(pgVar3->type);
  if (sVar23 == sVar22) {
    sVar23 = ggml_type_size(pgVar4->type);
    if (sVar8 == sVar23) {
      if (sVar32 == 4) {
        if (uVar16 < 4) {
          pcVar28 = "nb0 <= nb1";
          uVar37 = 0x1813;
        }
        else if (uVar17 < uVar16) {
          pcVar28 = "nb1 <= nb2";
          uVar37 = 0x1814;
        }
        else if (uVar30 < uVar17) {
          pcVar28 = "nb2 <= nb3";
          uVar37 = 0x1815;
        }
        else if (lVar24 == 1) {
          if (lVar34 == 1) {
            if (lVar31 == 1) {
              if (pgVar4->type == GGML_TYPE_F32) {
                iVar19 = pgVar5->ne[0];
                lVar24 = ggml_row_size(8,iVar12);
                local_100 = (uint)iVar35;
                lVar34 = lVar24 * lVar13;
                __n = (long)(int)local_100 * 8;
                uVar30 = lVar34 * lVar14 + 7U & 0xfffffffffffffff8;
                if ((lVar14 + 1) * __n + uVar30 <= params->wsize) {
                  pvVar20 = params->wdata;
                  if (0 < lVar14) {
                    pvVar42 = (void *)(lVar24 * lVar29 + (long)pvVar20);
                    lVar41 = sVar9 * lVar29;
                    lVar25 = 0;
                    lVar31 = lVar29;
                    pvVar43 = pvVar42;
                    lVar33 = lVar41;
                    do {
                      for (; lVar31 < lVar13; lVar31 = lVar31 + lVar27) {
                        (*p_Var18)((float *)((long)pgVar4->data + lVar41),pvVar42,iVar12);
                        pvVar42 = (void *)((long)pvVar42 + lVar24 * lVar27);
                        lVar41 = lVar41 + sVar9 * lVar27;
                      }
                      pvVar42 = (void *)((long)pvVar43 + lVar34);
                      lVar41 = lVar33 + sVar15;
                      lVar25 = lVar25 + 1;
                      lVar31 = lVar29;
                      pvVar43 = pvVar42;
                      lVar33 = lVar41;
                    } while (lVar25 != lVar14);
                  }
                  pvVar42 = (void *)((long)pvVar20 + uVar30);
                  if (iVar1 == 0) {
                    memset(pvVar42,0,__n);
                    iVar35 = pgVar5->ne[1];
                    if (0 < iVar35) {
                      uVar40 = (uint)iVar19;
                      lVar31 = 0;
                      do {
                        if (0 < (int)uVar40) {
                          pvVar43 = pgVar5->data;
                          uVar38 = 0;
                          do {
                            iVar2 = *(int *)((long)pvVar43 +
                                            pgVar5->nb[0] * uVar38 + pgVar5->nb[1] * lVar31);
                            lVar41 = (long)iVar2;
                            if ((lVar41 < 0) || ((int)local_100 <= iVar2)) {
                              pcVar28 = "i02 >= 0 && i02 < n_as";
                              uVar37 = 0x1848;
                              goto LAB_0011edfd;
                            }
                            lVar33 = *(long *)((long)pvVar42 + lVar41 * 8);
                            lVar25 = lVar14 * lVar41 * 8 + __n;
                            *(int *)((long)pvVar42 + lVar33 * 8 + lVar25) = (int)uVar38;
                            *(int *)((long)pvVar42 + lVar33 * 8 + lVar25 + 4) = (int)lVar31;
                            uVar38 = uVar38 + 1;
                            *(long *)((long)pvVar42 + lVar41 * 8) = lVar33 + 1;
                          } while ((uVar40 & 0x7fffffff) != uVar38);
                          iVar35 = pgVar5->ne[1];
                        }
                        lVar31 = lVar31 + 1;
                      } while (lVar31 < iVar35);
                    }
                  }
                  ggml_barrier(params->threadpool);
                  if (0 < (int)local_100) {
                    local_108 = 0;
                    lVar31 = (long)pvVar20 + uVar30 + __n + 4;
                    do {
                      lVar41 = *(long *)((long)pvVar42 + local_108 * 8);
                      if (lVar41 != 0) {
                        uVar38 = (lVar29 * lVar7) / lVar27;
                        uVar26 = ((iVar1 + 1) * lVar7) / lVar27;
                        uVar30 = uVar38 + 3;
                        if (-1 < (long)uVar38) {
                          uVar30 = uVar38;
                        }
                        uVar39 = (uVar30 & 0xfffffffffffffffc) + 4;
                        if (uVar38 == (uVar30 & 0xfffffffffffffffc)) {
                          uVar39 = uVar38;
                        }
                        uVar30 = uVar26 + 3;
                        if (-1 < (long)uVar26) {
                          uVar30 = uVar26;
                        }
                        uVar38 = (uVar30 & 0xfffffffffffffffc) + 4;
                        if (uVar26 == (uVar30 & 0xfffffffffffffffc)) {
                          uVar38 = uVar26;
                        }
                        if ((long)uVar38 <= (long)uVar39) {
                          return;
                        }
                        if (0 < lVar41) {
                          lVar33 = 0;
                          pvVar43 = pgVar3->data;
                          do {
                            lVar25 = (long)*(int *)(lVar31 + -4 + lVar33 * 8);
                            lVar36 = (long)*(int *)(lVar31 + lVar33 * 8);
                            sVar32 = (lVar25 % lVar13) * lVar24;
                            gemv<block_iq4_nl,4l,4l,(ggml_type)8>
                                      ((int)iVar6,
                                       (float *)((long)op->data +
                                                uVar39 * 4 + lVar36 * uVar17 + lVar25 * uVar16),
                                       sVar32,(void *)((long)pvVar43 +
                                                      uVar39 * sVar10 + sVar11 * local_108),
                                       (void *)((long)pvVar20 + sVar32 + lVar34 * lVar36),(int)op,
                                       (int)uVar38 - (int)uVar39);
                            lVar33 = lVar33 + 1;
                          } while (lVar41 != lVar33);
                        }
                      }
                      lVar31 = lVar31 + lVar14 * 8;
                      local_108 = local_108 + 1;
                    } while (local_108 != (local_100 & 0x7fffffff));
                  }
                  return;
                }
                pcVar28 = 
                "params->wsize >= (GGML_PAD(nbw3, sizeof(int64_t)) + n_as * sizeof(int64_t) + n_as * ne12 * sizeof(mmid_row_mapping))"
                ;
                uVar37 = 0x182b;
              }
              else {
                pcVar28 = "src1->type == GGML_TYPE_F32";
                uVar37 = 0x181b;
              }
            }
            else {
              pcVar28 = "ne3 == 1";
              uVar37 = 0x1819;
            }
          }
          else {
            pcVar28 = "ne13 == 1";
            uVar37 = 0x1818;
          }
        }
        else {
          pcVar28 = "ne03 == 1";
          uVar37 = 0x1817;
        }
      }
      else {
        pcVar28 = "nb0 == sizeof(float)";
        uVar37 = 0x1812;
      }
    }
    else {
      pcVar28 = "nb10 == ggml_type_size(src1->type)";
      uVar37 = 0x180f;
    }
  }
  else {
    pcVar28 = "nb00 == ggml_type_size(src0->type)";
    uVar37 = 0x180e;
  }
LAB_0011edfd:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ggml-cpu-aarch64.cpp"
             ,uVar37,"GGML_ASSERT(%s) failed",pcVar28);
}

Assistant:

void forward_mul_mat_id(ggml_compute_params * params, ggml_tensor * op) {
        const ggml_tensor * src0 = op->src[0];
        const ggml_tensor * src1 = op->src[1];
        const ggml_tensor * ids  = op->src[2];
        ggml_tensor *       dst  = op;

        GGML_TENSOR_BINARY_OP_LOCALS

        const int ith = params->ith;
        const int nth = params->nth;

        const ggml_from_float_t from_float = ggml_get_type_traits_cpu(PARAM_TYPE)->from_float;

        // we don't support permuted src0 or src1
        GGML_ASSERT(nb00 == ggml_type_size(src0->type));
        GGML_ASSERT(nb10 == ggml_type_size(src1->type));

        // dst cannot be transposed or permuted
        GGML_ASSERT(nb0 == sizeof(float));
        GGML_ASSERT(nb0 <= nb1);
        GGML_ASSERT(nb1 <= nb2);
        GGML_ASSERT(nb2 <= nb3);

        GGML_ASSERT(ne03 == 1);
        GGML_ASSERT(ne13 == 1);
        GGML_ASSERT(ne3  == 1);

        GGML_ASSERT(src1->type == GGML_TYPE_F32);

        // row groups
        const int n_ids = ids->ne[0]; // n_expert_used
        const int n_as  = ne02;       // n_expert

        const size_t nbw1 = ggml_row_size(PARAM_TYPE, ne10);
        const size_t nbw2 = nbw1*ne11;
        const size_t nbw3 = nbw2*ne12;

        struct mmid_row_mapping {
            int32_t i1;
            int32_t i2;
        };

        GGML_ASSERT(params->wsize >= (GGML_PAD(nbw3, sizeof(int64_t)) + n_as * sizeof(int64_t) +
                                      n_as * ne12 * sizeof(mmid_row_mapping)));

        auto * wdata             = (char *)     params->wdata;
        auto * wdata_src1_end    = (char *)     wdata + GGML_PAD(nbw3, sizeof(int64_t));
        auto * matrix_row_counts = (int64_t *) (wdata_src1_end); // [n_as]

        struct mmid_row_mapping * matrix_rows = (struct mmid_row_mapping *) (matrix_row_counts + n_as);  // [n_as][ne12]

        // src1: float32 => param type
        for (int64_t i12 = 0; i12 < ne12; ++i12) {
            for (int64_t i11 = ith; i11 < ne11; i11 += nth) {
                from_float((float *)((char *) src1->data + i12 * nb12 + i11 * nb11),
                           (void *)               (wdata + i12 * nbw2 + i11 * nbw1),
                           ne10);
            }
        }

#define MMID_MATRIX_ROW(row_id, i1) matrix_rows[(row_id) * ne12 + (i1)]

        if (ith == 0) {
            // initialize matrix_row_counts
            memset(matrix_row_counts, 0, n_as * sizeof(int64_t));

            // group rows by src0 matrix
            for (int32_t iid1 = 0; iid1 < ids->ne[1]; ++iid1) {
                for (int32_t id = 0; id < n_ids; ++id) {
                    const int32_t i02 =
                        *(const int32_t *) ((const char *) ids->data + iid1 * ids->nb[1] + id * ids->nb[0]);

                    GGML_ASSERT(i02 >= 0 && i02 < n_as);

                    MMID_MATRIX_ROW(i02, matrix_row_counts[i02]) = { id, iid1 };
                    matrix_row_counts[i02] += 1;
                }
            }
        }

        ggml_barrier(params->threadpool);

        // compute each matrix multiplication in sequence
        for (int cur_a = 0; cur_a < n_as; ++cur_a) {
            const int64_t cne1 = matrix_row_counts[cur_a];

            if (cne1 == 0) {
                continue;
            }

            const auto * src0_cur = (const char *) src0->data + cur_a*nb02;

            //const int64_t nr0 = ne01; // src0 rows
            const int64_t nr1 = cne1; // src1 rows

            int64_t src0_cur_start = (ith * ne01) / nth;
            int64_t src0_cur_end   = ((ith + 1) * ne01) / nth;

            src0_cur_start = (src0_cur_start % NB_COLS) ? src0_cur_start + NB_COLS - (src0_cur_start % NB_COLS) : src0_cur_start;
            src0_cur_end   = (src0_cur_end   % NB_COLS) ? src0_cur_end   + NB_COLS - (src0_cur_end   % NB_COLS) : src0_cur_end;

            if (src0_cur_start >= src0_cur_end) {
                return;
            }

            for (int ir1 = 0; ir1 < nr1; ir1++) {
                struct mmid_row_mapping row_mapping = MMID_MATRIX_ROW(cur_a, ir1);

                const int id = row_mapping.i1; // selected expert index

                const int64_t i11 = id % ne11;
                const int64_t i12 = row_mapping.i2; // row index in src1

                const int64_t i1 = id;  // selected expert index
                const int64_t i2 = i12; // row

                const auto * src1_col = (const char *) wdata + (i11 * nbw1 + i12 * nbw2);

                gemv<BLOC_TYPE, INTER_SIZE, NB_COLS, PARAM_TYPE>(ne00,
                        (float *)((char *) dst->data + (i1 * nb1 + i2 * nb2)) + src0_cur_start, ne01,
                        src0_cur + src0_cur_start * nb01,
                        src1_col, 1, src0_cur_end - src0_cur_start);
            }
        }
#undef MMID_MATRIX_ROW
    }